

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.cpp
# Opt level: O2

void __thiscall setup::ini_entry::load(ini_entry *this,istream *is,info *i)

{
  bitset<256UL> *pbVar1;
  byte bVar2;
  uint16_t uVar3;
  logger *plVar4;
  size_t i_1;
  ulong uVar5;
  enum_type *peVar6;
  ulong uVar7;
  ostringstream *poVar8;
  flag_type result;
  undefined1 local_1b0 [16];
  bitset<256UL> *local_1a0;
  
  if ((i->version).value < 0x1030000) {
    util::load<int,util::little_endian>(is);
  }
  local_1b0._8_4_ = i->codepage;
  pbVar1 = &(i->header).lead_bytes;
  local_1b0._0_8_ = &this->inifile;
  local_1a0 = pbVar1;
  util::operator>>(is,(encoded_string *)local_1b0);
  if ((this->inifile)._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&this->inifile);
  }
  local_1b0._0_8_ = &this->section;
  local_1b0._8_4_ = i->codepage;
  local_1a0 = pbVar1;
  util::operator>>(is,(encoded_string *)local_1b0);
  local_1b0._0_8_ = &this->key;
  local_1b0._8_4_ = i->codepage;
  local_1a0 = (bitset<256UL> *)0x0;
  util::operator>>(is,(encoded_string *)local_1b0);
  local_1b0._0_8_ = &this->value;
  local_1b0._8_4_ = i->codepage;
  local_1a0 = pbVar1;
  util::operator>>(is,(encoded_string *)local_1b0);
  item::load_condition_data(&this->super_item,is,i);
  windows_version_range::load(&(this->super_item).winver,is,&i->version);
  uVar3 = version::bits(&i->version);
  bVar2 = util::load<unsigned_char,util::little_endian>(is);
  uVar7 = (ulong)bVar2;
  if (uVar3 == 0x10) {
    result._flags.super__Base_bitset<1UL>._M_w = (Type)(_Base_bitset<1UL>)0x0;
    peVar6 = &(anonymous_namespace)::stored_ini_flags::values;
    for (uVar5 = 0; uVar5 != 5; uVar5 = uVar5 + 1) {
      if ((uVar7 >> (uVar5 & 0x3f) & 1) != 0) {
        flags<setup::component_entry::flags_Enum_,_5UL>::operator|=
                  ((flags<setup::component_entry::flags_Enum_,_5UL> *)&result,*peVar6);
        uVar7 = uVar7 & ~(1L << ((byte)uVar5 & 0x3f));
      }
      peVar6 = peVar6 + 1;
    }
    if (uVar7 == 0) goto LAB_00139c5a;
    local_1b0._0_4_ = 2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),"Unexpected ");
    plVar4 = logger::operator<<((logger *)local_1b0,&enum_names<setup::ini_entry::flags_Enum_>::name
                               );
    poVar8 = &plVar4->buffer;
    std::operator<<((ostream *)poVar8," flags: ");
    *(uint *)(&plVar4->field_0x20 + *(long *)(*(long *)poVar8 + -0x18)) =
         *(uint *)(&plVar4->field_0x20 + *(long *)(*(long *)poVar8 + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  }
  else {
    result._flags.super__Base_bitset<1UL>._M_w = (Type)(_Base_bitset<1UL>)0x0;
    peVar6 = &(anonymous_namespace)::stored_ini_flags::values;
    for (uVar5 = 0; uVar5 != 5; uVar5 = uVar5 + 1) {
      if ((uVar7 >> (uVar5 & 0x3f) & 1) != 0) {
        flags<setup::component_entry::flags_Enum_,_5UL>::operator|=
                  ((flags<setup::component_entry::flags_Enum_,_5UL> *)&result,*peVar6);
        uVar7 = uVar7 & ~(1L << ((byte)uVar5 & 0x3f));
      }
      peVar6 = peVar6 + 1;
    }
    if (uVar7 == 0) goto LAB_00139c5a;
    local_1b0._0_4_ = 2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),"Unexpected ");
    plVar4 = logger::operator<<((logger *)local_1b0,&enum_names<setup::ini_entry::flags_Enum_>::name
                               );
    poVar8 = &plVar4->buffer;
    std::operator<<((ostream *)poVar8," flags: ");
    *(uint *)(&plVar4->field_0x20 + *(long *)(*(long *)poVar8 + -0x18)) =
         *(uint *)(&plVar4->field_0x20 + *(long *)(*(long *)poVar8 + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  }
  *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
       *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
  logger::~logger((logger *)local_1b0);
LAB_00139c5a:
  (this->options)._flags.super__Base_bitset<1UL>._M_w =
       (_WordT)result._flags.super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

void ini_entry::load(std::istream & is, const info & i) {
	
	if(i.version < INNO_VERSION(1, 3, 0)) {
		(void)util::load<boost::uint32_t>(is); // uncompressed size of the entry
	}
	
	is >> util::encoded_string(inifile, i.codepage, i.header.lead_bytes);
	if(inifile.empty()) {
		inifile = "{windows}/WIN.INI";
	}
	is >> util::encoded_string(section, i.codepage, i.header.lead_bytes);
	is >> util::encoded_string(key, i.codepage);
	is >> util::encoded_string(value, i.codepage, i.header.lead_bytes);
	
	load_condition_data(is, i);
	
	load_version_data(is, i.version);
	
	if(i.version.bits() != 16) {
		options = stored_flags<stored_ini_flags>(is).get();
	} else {
		options = stored_flags<stored_ini_flags, 16>(is).get();
	}
}